

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-bool.cpp
# Opt level: O3

void __thiscall BoolLinearLE<0>::BoolLinearLE(BoolLinearLE<0> *this,vec<BoolView> *_x,IntView<0> _y)

{
  IntVar *pIVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  BoolLinearLE<0> *local_38;
  
  pIVar1 = _y.var;
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Propagator_0020be88;
  (this->super_Propagator).prop_id = engine.propagators.sz;
  uVar4 = 0;
  (this->super_Propagator).priority = 0;
  (this->super_Propagator).satisfied = '\0';
  (this->super_Propagator).in_queue = false;
  local_38 = this;
  vec<Propagator_*>::push(&engine.propagators,(Propagator **)&local_38);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__BoolLinearLE_0020c020;
  vec<BoolView>::vec<BoolView>(&this->x,_x);
  (this->y).var = pIVar1;
  (this->y).a = (int)_y._8_8_;
  (this->y).b = (int)((ulong)_y._8_8_ >> 0x20);
  (this->ones).v = 0;
  (this->ps).sz = 0;
  (this->ps).cap = 0;
  (this->ps).data = (Lit *)0x0;
  if ((this->x).sz != 0) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      BoolView::attach((BoolView *)
                       ((long)&(((this->x).data)->super_Var).super_Branching._vptr_Branching + lVar3
                       ),&this->super_Propagator,(int)uVar2,2);
      uVar2 = uVar2 + 1;
      uVar4 = (ulong)(this->x).sz;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 < uVar4);
    pIVar1 = (this->y).var;
  }
  (*(pIVar1->super_Var).super_Branching._vptr_Branching[7])(pIVar1,this,uVar4,4);
  return;
}

Assistant:

BoolLinearLE(vec<BoolView>& _x, IntView<U> _y) : x(_x), y(_y), ones(0) {
		for (unsigned int i = 0; i < x.size(); i++) {
			x[i].attach(this, i, EVENT_L);
		}
		y.attach(this, x.size(), EVENT_U);
	}